

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::PipelineStateVkImpl::InitializePipeline
          (PipelineStateVkImpl *this,RayTracingPipelineStateCreateInfo *CreateInfo)

{
  VulkanLogicalDevice *this_00;
  RayTracingPipelineData *pRVar1;
  RayTracingGeneralShaderGroup *pRVar2;
  RayTracingTriangleHitShaderGroup *pRVar3;
  RayTracingProceduralHitShaderGroup *pRVar4;
  IPipelineStateCache *pSrcPtr;
  uint uVar5;
  VkResult VVar6;
  __node_base_ptr p_Var7;
  long lVar8;
  VkPipelineCache cache;
  ulong uVar9;
  char (*Args) [34];
  _Hash_node_base *p_Var10;
  vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  *ShaderModules_00;
  long lVar11;
  char (*Args_00) [28];
  char (*Args_01) [32];
  string msg;
  vector<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
  vkShaderGroups;
  long local_118;
  RayTracingPipelineStateCreateInfo *local_110;
  _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_108;
  anon_class_8_1_b52c7398 GetShaderModuleIndex;
  VkRayTracingShaderGroupCreateInfoKHR Group;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  vkShaderStages;
  vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ShaderModules;
  TShaderStages ShaderStages;
  
  this_00 = (((this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
             .m_pDevice)->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  vkShaderStages.
  super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vkShaderStages.
  super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vkShaderStages.
  super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ShaderModules_00 = &ShaderModules;
  ShaderModules.
  super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ShaderModules.
  super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ShaderModules.
  super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  InitInternalObjects<Diligent::RayTracingPipelineStateCreateInfo>
            (&ShaderStages,this,CreateInfo,&vkShaderStages,ShaderModules_00);
  pRVar1 = (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).field_6.
           m_pRayTracingPipelineData;
  vkShaderGroups.
  super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vkShaderGroups.
  super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vkShaderGroups.
  super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetShaderModuleIndex.ShaderStages = &ShaderStages;
  std::
  vector<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
  ::reserve(&vkShaderGroups,
            (ulong)CreateInfo->ProceduralHitShaderCount +
            (ulong)CreateInfo->TriangleHitShaderCount + (ulong)CreateInfo->GeneralShaderCount);
  local_108 = &(pRVar1->NameToGroupIndex)._M_h;
  local_110 = CreateInfo;
  if (CreateInfo->GeneralShaderCount != 0) {
    lVar11 = 0;
    uVar9 = 0;
    do {
      pRVar2 = local_110->pGeneralShaders;
      Group.pNext = (void *)0x0;
      Group.closestHitShader = 0;
      Group.anyHitShader = 0;
      Group.intersectionShader = 0;
      Group._36_4_ = 0;
      Group.pShaderGroupCaptureReplayHandle = (void *)0x0;
      Group.sType = VK_STRUCTURE_TYPE_RAY_TRACING_SHADER_GROUP_CREATE_INFO_KHR;
      Group._4_4_ = 0;
      Group.type = VK_RAY_TRACING_SHADER_GROUP_TYPE_GENERAL_KHR;
      Group.generalShader = 0;
      uVar5 = anon_unknown_231::BuildRTShaderGroupDescription::anon_class_8_1_b52c7398::operator()
                        (&GetShaderModuleIndex,*(IShader **)((long)&pRVar2->pShader + lVar11));
      Args_00 = (char (*) [28])((long)&pRVar2->Name + lVar11);
      Group.generalShader = uVar5;
      Group.closestHitShader = 0xffffffff;
      Group.anyHitShader = 0xffffffff;
      Group.intersectionShader = 0xffffffff;
      HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg,*(Char **)*Args_00,false);
      p_Var7 = std::
               _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         (local_108,
                          (msg._M_string_length & 0x7fffffffffffffff) %
                          (pRVar1->NameToGroupIndex)._M_h._M_bucket_count,(key_type *)&msg,
                          msg._M_string_length & 0x7fffffffffffffff);
      if (p_Var7 == (__node_base_ptr)0x0) {
        p_Var10 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var10 = p_Var7->_M_nxt;
      }
      if ((msg._M_dataplus._M_p != (pointer)0x0) && ((long)msg._M_string_length < 0)) {
        operator_delete__(msg._M_dataplus._M_p);
      }
      if (p_Var10 == (_Hash_node_base *)0x0) {
        FormatString<char[28],char_const*,char[130]>
                  (&msg,(Diligent *)"Can\'t find general shader \'",Args_00,
                   (char **)
                   "\'. This looks to be a bug as NameToGroupIndex is initialized by CopyRTShaderGroupNames() that processes the same general shaders."
                   ,(char (*) [130])ShaderModules_00);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"BuildRTShaderGroupDescription",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x1c9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      lVar8 = ((long)vkShaderGroups.
                     super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)vkShaderGroups.
                     super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
      if (lVar8 - (ulong)*(uint *)&p_Var10[3]._M_nxt != 0) {
        ShaderModules_00 =
             (vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
              *)(p_Var10 + 3);
        local_118 = lVar8;
        FormatString<char[23],char_const*,char[20],unsigned_int,char[5],unsigned_long,char[140]>
                  (&msg,(Diligent *)"General shader group \'",(char (*) [23])Args_00,
                   (char **)"\' index mismatch: (",(char (*) [20])ShaderModules_00,(uint *)" != ",
                   (char (*) [5])&local_118,
                   (unsigned_long *)
                   "). This looks to be a bug as NameToGroupIndex is initialized by CopyRTShaderGroupNames() that processes the same shaders in the same order."
                   ,(char (*) [140])msg._M_dataplus._M_p);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"BuildRTShaderGroupDescription",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x1cd);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (vkShaderGroups.
          super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          vkShaderGroups.
          super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<VkRayTracingShaderGroupCreateInfoKHR,std::allocator<VkRayTracingShaderGroupCreateInfoKHR>>
        ::_M_realloc_insert<VkRayTracingShaderGroupCreateInfoKHR_const&>
                  ((vector<VkRayTracingShaderGroupCreateInfoKHR,std::allocator<VkRayTracingShaderGroupCreateInfoKHR>>
                    *)&vkShaderGroups,
                   (iterator)
                   vkShaderGroups.
                   super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&Group);
      }
      else {
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->intersectionShader = Group.intersectionShader;
        *(undefined4 *)
         &(vkShaderGroups.
           super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
           ._M_impl.super__Vector_impl_data._M_finish)->field_0x24 = Group._36_4_;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->pShaderGroupCaptureReplayHandle =
             Group.pShaderGroupCaptureReplayHandle;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->type = Group.type;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->generalShader = Group.generalShader;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->closestHitShader = Group.closestHitShader;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->anyHitShader = Group.anyHitShader;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->sType = Group.sType;
        *(undefined4 *)
         &(vkShaderGroups.
           super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
           ._M_impl.super__Vector_impl_data._M_finish)->field_0x4 = Group._4_4_;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->pNext = Group.pNext;
        vkShaderGroups.
        super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             vkShaderGroups.
             super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar9 = uVar9 + 1;
      lVar11 = lVar11 + 0x10;
    } while (uVar9 < local_110->GeneralShaderCount);
  }
  if (local_110->TriangleHitShaderCount != 0) {
    lVar11 = 0;
    uVar9 = 0;
    do {
      pRVar3 = local_110->pTriangleHitShaders;
      Group.pNext = (void *)0x0;
      Group.closestHitShader = 0;
      Group.anyHitShader = 0;
      Group.intersectionShader = 0;
      Group._36_4_ = 0;
      Group.pShaderGroupCaptureReplayHandle = (void *)0x0;
      Group.sType = VK_STRUCTURE_TYPE_RAY_TRACING_SHADER_GROUP_CREATE_INFO_KHR;
      Group._4_4_ = 0;
      Group.type = VK_RAY_TRACING_SHADER_GROUP_TYPE_TRIANGLES_HIT_GROUP_KHR;
      Group.generalShader = 0xffffffff;
      uVar5 = anon_unknown_231::BuildRTShaderGroupDescription::anon_class_8_1_b52c7398::operator()
                        (&GetShaderModuleIndex,
                         *(IShader **)((long)&pRVar3->pClosestHitShader + lVar11));
      Group.closestHitShader = uVar5;
      uVar5 = anon_unknown_231::BuildRTShaderGroupDescription::anon_class_8_1_b52c7398::operator()
                        (&GetShaderModuleIndex,*(IShader **)((long)&pRVar3->pAnyHitShader + lVar11))
      ;
      Args_01 = (char (*) [32])((long)&pRVar3->Name + lVar11);
      Group.anyHitShader = uVar5;
      Group.intersectionShader = 0xffffffff;
      HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg,*(Char **)*Args_01,false);
      p_Var7 = std::
               _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         (local_108,
                          (msg._M_string_length & 0x7fffffffffffffff) %
                          (pRVar1->NameToGroupIndex)._M_h._M_bucket_count,(key_type *)&msg,
                          msg._M_string_length & 0x7fffffffffffffff);
      if (p_Var7 == (__node_base_ptr)0x0) {
        p_Var10 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var10 = p_Var7->_M_nxt;
      }
      if ((msg._M_dataplus._M_p != (pointer)0x0) && ((long)msg._M_string_length < 0)) {
        operator_delete__(msg._M_dataplus._M_p);
      }
      if (p_Var10 == (_Hash_node_base *)0x0) {
        FormatString<char[32],char_const*,char[125]>
                  (&msg,(Diligent *)"Can\'t find triangle hit group \'",Args_01,
                   (char **)
                   "\'. This looks to be a bug as NameToGroupIndex is initialized by CopyRTShaderGroupNames() that processes the same hit groups."
                   ,(char (*) [125])ShaderModules_00);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"BuildRTShaderGroupDescription",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x1e6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      lVar8 = ((long)vkShaderGroups.
                     super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)vkShaderGroups.
                     super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
      if (lVar8 - (ulong)*(uint *)&p_Var10[3]._M_nxt != 0) {
        ShaderModules_00 =
             (vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
              *)(p_Var10 + 3);
        local_118 = lVar8;
        FormatString<char[21],char_const*,char[20],unsigned_int,char[5],unsigned_long,char[143]>
                  (&msg,(Diligent *)"Triangle hit group \'",(char (*) [21])Args_01,
                   (char **)"\' index mismatch: (",(char (*) [20])ShaderModules_00,(uint *)" != ",
                   (char (*) [5])&local_118,
                   (unsigned_long *)
                   "). This looks to be a bug as NameToGroupIndex is initialized by CopyRTShaderGroupNames() that processes the same hit groups in the same order."
                   ,(char (*) [143])msg._M_dataplus._M_p);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"BuildRTShaderGroupDescription",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x1ea);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (vkShaderGroups.
          super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          vkShaderGroups.
          super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<VkRayTracingShaderGroupCreateInfoKHR,std::allocator<VkRayTracingShaderGroupCreateInfoKHR>>
        ::_M_realloc_insert<VkRayTracingShaderGroupCreateInfoKHR_const&>
                  ((vector<VkRayTracingShaderGroupCreateInfoKHR,std::allocator<VkRayTracingShaderGroupCreateInfoKHR>>
                    *)&vkShaderGroups,
                   (iterator)
                   vkShaderGroups.
                   super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&Group);
      }
      else {
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->intersectionShader = Group.intersectionShader;
        *(undefined4 *)
         &(vkShaderGroups.
           super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
           ._M_impl.super__Vector_impl_data._M_finish)->field_0x24 = Group._36_4_;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->pShaderGroupCaptureReplayHandle =
             Group.pShaderGroupCaptureReplayHandle;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->type = Group.type;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->generalShader = Group.generalShader;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->closestHitShader = Group.closestHitShader;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->anyHitShader = Group.anyHitShader;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->sType = Group.sType;
        *(undefined4 *)
         &(vkShaderGroups.
           super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
           ._M_impl.super__Vector_impl_data._M_finish)->field_0x4 = Group._4_4_;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->pNext = Group.pNext;
        vkShaderGroups.
        super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             vkShaderGroups.
             super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar9 = uVar9 + 1;
      lVar11 = lVar11 + 0x18;
    } while (uVar9 < local_110->TriangleHitShaderCount);
  }
  if (local_110->ProceduralHitShaderCount != 0) {
    lVar11 = 0;
    uVar9 = 0;
    do {
      pRVar4 = local_110->pProceduralHitShaders;
      Group.pNext = (void *)0x0;
      Group.closestHitShader = 0;
      Group.anyHitShader = 0;
      Group.intersectionShader = 0;
      Group._36_4_ = 0;
      Group.pShaderGroupCaptureReplayHandle = (void *)0x0;
      Group.sType = VK_STRUCTURE_TYPE_RAY_TRACING_SHADER_GROUP_CREATE_INFO_KHR;
      Group._4_4_ = 0;
      Group.type = VK_RAY_TRACING_SHADER_GROUP_TYPE_PROCEDURAL_HIT_GROUP_KHR;
      Group.generalShader = 0xffffffff;
      uVar5 = anon_unknown_231::BuildRTShaderGroupDescription::anon_class_8_1_b52c7398::operator()
                        (&GetShaderModuleIndex,
                         *(IShader **)((long)&pRVar4->pIntersectionShader + lVar11));
      Group.intersectionShader = uVar5;
      uVar5 = anon_unknown_231::BuildRTShaderGroupDescription::anon_class_8_1_b52c7398::operator()
                        (&GetShaderModuleIndex,
                         *(IShader **)((long)&pRVar4->pClosestHitShader + lVar11));
      Group.closestHitShader = uVar5;
      uVar5 = anon_unknown_231::BuildRTShaderGroupDescription::anon_class_8_1_b52c7398::operator()
                        (&GetShaderModuleIndex,*(IShader **)((long)&pRVar4->pAnyHitShader + lVar11))
      ;
      Args = (char (*) [34])((long)&pRVar4->Name + lVar11);
      Group.anyHitShader = uVar5;
      HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg,*(Char **)*Args,false);
      p_Var7 = std::
               _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         (local_108,
                          (msg._M_string_length & 0x7fffffffffffffff) %
                          (pRVar1->NameToGroupIndex)._M_h._M_bucket_count,(key_type *)&msg,
                          msg._M_string_length & 0x7fffffffffffffff);
      if (p_Var7 == (__node_base_ptr)0x0) {
        p_Var10 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var10 = p_Var7->_M_nxt;
      }
      if ((msg._M_dataplus._M_p != (pointer)0x0) && ((long)msg._M_string_length < 0)) {
        operator_delete__(msg._M_dataplus._M_p);
      }
      if (p_Var10 == (_Hash_node_base *)0x0) {
        FormatString<char[34],char_const*,char[125]>
                  (&msg,(Diligent *)"Can\'t find procedural hit group \'",Args,
                   (char **)
                   "\'. This looks to be a bug as NameToGroupIndex is initialized by CopyRTShaderGroupNames() that processes the same hit groups."
                   ,(char (*) [125])ShaderModules_00);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"BuildRTShaderGroupDescription",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x203);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      lVar8 = ((long)vkShaderGroups.
                     super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)vkShaderGroups.
                     super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
      if (lVar8 - (ulong)*(uint *)&p_Var10[3]._M_nxt != 0) {
        ShaderModules_00 =
             (vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
              *)(p_Var10 + 3);
        local_118 = lVar8;
        FormatString<char[23],char_const*,char[20],unsigned_int,char[5],unsigned_long,char[143]>
                  (&msg,(Diligent *)"Procedural hit group \'",(char (*) [23])Args,
                   (char **)"\' index mismatch: (",(char (*) [20])ShaderModules_00,(uint *)" != ",
                   (char (*) [5])&local_118,
                   (unsigned_long *)
                   "). This looks to be a bug as NameToGroupIndex is initialized by CopyRTShaderGroupNames() that processes the same hit groups in the same order."
                   ,(char (*) [143])msg._M_dataplus._M_p);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"BuildRTShaderGroupDescription",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                   ,0x207);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (vkShaderGroups.
          super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          vkShaderGroups.
          super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<VkRayTracingShaderGroupCreateInfoKHR,std::allocator<VkRayTracingShaderGroupCreateInfoKHR>>
        ::_M_realloc_insert<VkRayTracingShaderGroupCreateInfoKHR_const&>
                  ((vector<VkRayTracingShaderGroupCreateInfoKHR,std::allocator<VkRayTracingShaderGroupCreateInfoKHR>>
                    *)&vkShaderGroups,
                   (iterator)
                   vkShaderGroups.
                   super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&Group);
      }
      else {
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->intersectionShader = Group.intersectionShader;
        *(undefined4 *)
         &(vkShaderGroups.
           super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
           ._M_impl.super__Vector_impl_data._M_finish)->field_0x24 = Group._36_4_;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->pShaderGroupCaptureReplayHandle =
             Group.pShaderGroupCaptureReplayHandle;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->type = Group.type;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->generalShader = Group.generalShader;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->closestHitShader = Group.closestHitShader;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->anyHitShader = Group.anyHitShader;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->sType = Group.sType;
        *(undefined4 *)
         &(vkShaderGroups.
           super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
           ._M_impl.super__Vector_impl_data._M_finish)->field_0x4 = Group._4_4_;
        (vkShaderGroups.
         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
         ._M_impl.super__Vector_impl_data._M_finish)->pNext = Group.pNext;
        vkShaderGroups.
        super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             vkShaderGroups.
             super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar9 = uVar9 + 1;
      lVar11 = lVar11 + 0x20;
    } while (uVar9 < local_110->ProceduralHitShaderCount);
  }
  pSrcPtr = (local_110->super_PipelineStateCreateInfo).pPSOCache;
  if (pSrcPtr == (IPipelineStateCache *)0x0) {
    cache = (VkPipelineCache)0x0;
  }
  else {
    CheckDynamicType<Diligent::PipelineStateCacheVkImpl,Diligent::IPipelineStateCache>(pSrcPtr);
    cache = (VkPipelineCache)pSrcPtr[9].super_IDeviceObject.super_IObject._vptr_IObject;
  }
  Group.sType = VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR;
  Group._4_4_ = 0;
  Group.pNext = (void *)0x0;
  Group.generalShader =
       (int)((ulong)((long)vkShaderStages.
                           super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vkShaderStages.
                          super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
  Group.type = VK_RAY_TRACING_SHADER_GROUP_TYPE_TRIANGLES_HIT_GROUP_KHR;
  Group._24_8_ = vkShaderStages.
                 super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  Group._36_4_ = 0;
  Group.intersectionShader =
       (int)((ulong)((long)vkShaderGroups.
                           super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vkShaderGroups.
                          super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555;
  Group.pShaderGroupCaptureReplayHandle =
       vkShaderGroups.
       super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
       ._M_impl.super__Vector_impl_data._M_start;
  VulkanUtilities::VulkanLogicalDevice::CreateRayTracingPipeline
            ((PipelineWrapper *)&msg,
             (((this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
              .m_pDevice)->m_LogicalVkDevice).
             super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(VkRayTracingPipelineCreateInfoKHR *)&Group,cache,
             (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::VulkanObjectWrapper<VkPipeline_T_*,_(VulkanUtilities::VulkanHandleTypeId)9>::
  operator=(&this->m_Pipeline,
            (VulkanObjectWrapper<VkPipeline_T_*,_(VulkanUtilities::VulkanHandleTypeId)9> *)&msg);
  VulkanUtilities::VulkanObjectWrapper<VkPipeline_T_*,_(VulkanUtilities::VulkanHandleTypeId)9>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkPipeline_T_*,_(VulkanUtilities::VulkanHandleTypeId)9> *)&msg);
  if ((((this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).field_6.
       m_pRayTracingPipelineData)->NameToGroupIndex)._M_h._M_element_count !=
      ((long)vkShaderGroups.
             super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)vkShaderGroups.
             super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555) {
    FormatString<char[108]>
              ((string *)&Group,
               (char (*) [108])
               "The size of NameToGroupIndex map does not match the actual number of groups in the pipeline. This is a bug."
              );
    DebugAssertionFailed
              ((Char *)Group._0_8_,"InitializePipeline",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x37c);
    if ((VkRayTracingShaderGroupTypeKHR *)Group._0_8_ != &Group.type) {
      operator_delete((void *)Group._0_8_,Group._16_8_ + 1);
    }
  }
  pRVar1 = (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).field_6.
           m_pRayTracingPipelineData;
  VVar6 = VulkanUtilities::VulkanLogicalDevice::GetRayTracingShaderGroupHandles
                    (this_00,(this->m_Pipeline).m_VkObject,0,
                     (int)((ulong)((long)vkShaderGroups.
                                         super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)vkShaderGroups.
                                        super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555,(ulong)pRVar1->ShaderDataSize,pRVar1->ShaderHandles);
  if (VVar6 != VK_SUCCESS) {
    FormatString<char[35]>((string *)&Group,(char (*) [35])"Failed to get shader group handles");
    DebugAssertionFailed
              ((Char *)Group._0_8_,"InitializePipeline",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x37f);
    if ((VkRayTracingShaderGroupTypeKHR *)Group._0_8_ != &Group.type) {
      operator_delete((void *)Group._0_8_,Group._16_8_ + 1);
    }
  }
  if (vkShaderGroups.
      super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vkShaderGroups.
                    super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vkShaderGroups.
                          super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vkShaderGroups.
                          super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ::~vector(&ShaderStages);
  std::
  vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ::~vector(&ShaderModules);
  if (vkShaderStages.
      super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vkShaderStages.
                    super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vkShaderStages.
                          super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vkShaderStages.
                          super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PipelineStateVkImpl::InitializePipeline(const RayTracingPipelineStateCreateInfo& CreateInfo)
{
    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();

    std::vector<VkPipelineShaderStageCreateInfo>      vkShaderStages;
    std::vector<VulkanUtilities::ShaderModuleWrapper> ShaderModules;

    const PipelineStateVkImpl::TShaderStages                ShaderStages   = InitInternalObjects(CreateInfo, vkShaderStages, ShaderModules);
    const std::vector<VkRayTracingShaderGroupCreateInfoKHR> vkShaderGroups = BuildRTShaderGroupDescription(CreateInfo, m_pRayTracingPipelineData->NameToGroupIndex, ShaderStages);
    const VkPipelineCache                                   vkSPOCache     = CreateInfo.pPSOCache != nullptr ? ClassPtrCast<PipelineStateCacheVkImpl>(CreateInfo.pPSOCache)->GetVkPipelineCache() : VK_NULL_HANDLE;

    CreateRayTracingPipeline(m_pDevice, vkShaderStages, vkShaderGroups, m_PipelineLayout, m_Desc, m_pRayTracingPipelineData->Desc, m_Pipeline, vkSPOCache);

    VERIFY(m_pRayTracingPipelineData->NameToGroupIndex.size() == vkShaderGroups.size(),
           "The size of NameToGroupIndex map does not match the actual number of groups in the pipeline. This is a bug.");
    // Get shader group handles from the PSO.
    VkResult err = LogicalDevice.GetRayTracingShaderGroupHandles(m_Pipeline, 0, static_cast<uint32_t>(vkShaderGroups.size()), m_pRayTracingPipelineData->ShaderDataSize, m_pRayTracingPipelineData->ShaderHandles);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to get shader group handles");
    (void)err;
}